

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O0

char * __thiscall cmState::GetGlobalProperty(cmState *this,string *prop)

{
  bool bVar1;
  char *pcVar2;
  char *local_228;
  char *local_218;
  allocator<char> local_1e9;
  string local_1e8;
  undefined1 local_1c8 [8];
  string mode;
  string local_1a0;
  string local_180;
  string local_160 [8];
  string langs;
  string local_138;
  allocator<char> local_111;
  string local_110;
  string local_f0;
  allocator<char> local_c9;
  string local_c8;
  undefined1 local_a8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commands;
  allocator<char> local_59;
  string local_58;
  undefined1 local_38 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cacheKeys;
  string *prop_local;
  cmState *this_local;
  
  cacheKeys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = prop;
  bVar1 = std::operator==(prop,"CACHE_VARIABLES");
  if (bVar1) {
    GetCacheEntryKeys_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_38,this);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"CACHE_VARIABLES",&local_59);
    cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ((string *)
               &commands.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_38,";");
    pcVar2 = (char *)std::__cxx11::string::c_str();
    SetGlobalProperty(this,&local_58,pcVar2);
    std::__cxx11::string::~string
              ((string *)
               &commands.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string((string *)&local_58);
    std::allocator<char>::~allocator(&local_59);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_38);
  }
  else {
    bVar1 = std::operator==(cacheKeys.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,"COMMANDS");
    if (bVar1) {
      GetCommandNames_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_a8,this);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"COMMANDS",&local_c9);
      cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                (&local_f0,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_a8,";");
      pcVar2 = (char *)std::__cxx11::string::c_str();
      SetGlobalProperty(this,&local_c8,pcVar2);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_c8);
      std::allocator<char>::~allocator(&local_c9);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_a8);
    }
    else {
      bVar1 = std::operator==(cacheKeys.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,"IN_TRY_COMPILE");
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_110,"IN_TRY_COMPILE",&local_111);
        if ((this->IsInTryCompile & 1U) == 0) {
          local_218 = "0";
        }
        else {
          local_218 = "1";
        }
        SetGlobalProperty(this,&local_110,local_218);
        std::__cxx11::string::~string((string *)&local_110);
        std::allocator<char>::~allocator(&local_111);
      }
      else {
        bVar1 = std::operator==(cacheKeys.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                "GENERATOR_IS_MULTI_CONFIG");
        if (bVar1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_138,"GENERATOR_IS_MULTI_CONFIG",
                     (allocator<char> *)(langs.field_2._M_local_buf + 0xf));
          if ((this->IsGeneratorMultiConfig & 1U) == 0) {
            local_228 = "0";
          }
          else {
            local_228 = "1";
          }
          SetGlobalProperty(this,&local_138,local_228);
          std::__cxx11::string::~string((string *)&local_138);
          std::allocator<char>::~allocator((allocator<char> *)(langs.field_2._M_local_buf + 0xf));
        }
        else {
          bVar1 = std::operator==(cacheKeys.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                  "ENABLED_LANGUAGES");
          if (bVar1) {
            std::__cxx11::string::string(local_160);
            cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                      (&local_180,&this->EnabledLanguages,";");
            std::__cxx11::string::operator=(local_160,(string *)&local_180);
            std::__cxx11::string::~string((string *)&local_180);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1a0,"ENABLED_LANGUAGES",
                       (allocator<char> *)(mode.field_2._M_local_buf + 0xf));
            pcVar2 = (char *)std::__cxx11::string::c_str();
            SetGlobalProperty(this,&local_1a0,pcVar2);
            std::__cxx11::string::~string((string *)&local_1a0);
            std::allocator<char>::~allocator((allocator<char> *)(mode.field_2._M_local_buf + 0xf));
            std::__cxx11::string::~string(local_160);
          }
          else {
            bVar1 = std::operator==(cacheKeys.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,"CMAKE_ROLE")
            ;
            if (bVar1) {
              GetModeString_abi_cxx11_((string *)local_1c8,this);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_1e8,"CMAKE_ROLE",&local_1e9);
              pcVar2 = (char *)std::__cxx11::string::c_str();
              SetGlobalProperty(this,&local_1e8,pcVar2);
              std::__cxx11::string::~string((string *)&local_1e8);
              std::allocator<char>::~allocator(&local_1e9);
              std::__cxx11::string::~string((string *)local_1c8);
            }
          }
        }
      }
    }
  }
  bVar1 = std::operator==(cacheKeys.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          "CMAKE_C_KNOWN_FEATURES");
  if (bVar1) {
    this_local = (cmState *)0x89aa08;
  }
  else {
    bVar1 = std::operator==(cacheKeys.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,
                            "CMAKE_C90_KNOWN_FEATURES");
    if (bVar1) {
      this_local = (cmState *)0x89aa80;
    }
    else {
      bVar1 = std::operator==(cacheKeys.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                              "CMAKE_C99_KNOWN_FEATURES");
      if (bVar1) {
        this_local = (cmState *)0x89aab0;
      }
      else {
        bVar1 = std::operator==(cacheKeys.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                "CMAKE_C11_KNOWN_FEATURES");
        if (bVar1) {
          this_local = (cmState *)0x89aa56;
        }
        else {
          bVar1 = std::operator==(cacheKeys.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                  "CMAKE_CXX_KNOWN_FEATURES");
          if (bVar1) {
            this_local = (cmState *)0x89ab00;
          }
          else {
            bVar1 = std::operator==(cacheKeys.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                    "CMAKE_CXX98_KNOWN_FEATURES");
            if (bVar1) {
              this_local = (cmState *)0x89b042;
            }
            else {
              bVar1 = std::operator==(cacheKeys.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                      "CMAKE_CXX11_KNOWN_FEATURES");
              if (bVar1) {
                this_local = (cmState *)0x89b07f;
              }
              else {
                bVar1 = std::operator==(cacheKeys.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                        "CMAKE_CXX14_KNOWN_FEATURES");
                if (bVar1) {
                  this_local = (cmState *)0x89af20;
                }
                else {
                  this_local = (cmState *)
                               cmPropertyMap::GetPropertyValue
                                         (&this->GlobalProperties,
                                          cacheKeys.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
                }
              }
            }
          }
        }
      }
    }
  }
  return (char *)this_local;
}

Assistant:

const char* cmState::GetGlobalProperty(const std::string& prop)
{
  if (prop == "CACHE_VARIABLES") {
    std::vector<std::string> cacheKeys = this->GetCacheEntryKeys();
    this->SetGlobalProperty("CACHE_VARIABLES", cmJoin(cacheKeys, ";").c_str());
  } else if (prop == "COMMANDS") {
    std::vector<std::string> commands = this->GetCommandNames();
    this->SetGlobalProperty("COMMANDS", cmJoin(commands, ";").c_str());
  } else if (prop == "IN_TRY_COMPILE") {
    this->SetGlobalProperty("IN_TRY_COMPILE",
                            this->IsInTryCompile ? "1" : "0");
  } else if (prop == "GENERATOR_IS_MULTI_CONFIG") {
    this->SetGlobalProperty("GENERATOR_IS_MULTI_CONFIG",
                            this->IsGeneratorMultiConfig ? "1" : "0");
  } else if (prop == "ENABLED_LANGUAGES") {
    std::string langs;
    langs = cmJoin(this->EnabledLanguages, ";");
    this->SetGlobalProperty("ENABLED_LANGUAGES", langs.c_str());
  } else if (prop == "CMAKE_ROLE") {
    std::string mode = this->GetModeString();
    this->SetGlobalProperty("CMAKE_ROLE", mode.c_str());
  }
#define STRING_LIST_ELEMENT(F) ";" #F
  if (prop == "CMAKE_C_KNOWN_FEATURES") {
    return &FOR_EACH_C_FEATURE(STRING_LIST_ELEMENT)[1];
  }
  if (prop == "CMAKE_C90_KNOWN_FEATURES") {
    return &FOR_EACH_C90_FEATURE(STRING_LIST_ELEMENT)[1];
  }
  if (prop == "CMAKE_C99_KNOWN_FEATURES") {
    return &FOR_EACH_C99_FEATURE(STRING_LIST_ELEMENT)[1];
  }
  if (prop == "CMAKE_C11_KNOWN_FEATURES") {
    return &FOR_EACH_C11_FEATURE(STRING_LIST_ELEMENT)[1];
  }
  if (prop == "CMAKE_CXX_KNOWN_FEATURES") {
    return &FOR_EACH_CXX_FEATURE(STRING_LIST_ELEMENT)[1];
  }
  if (prop == "CMAKE_CXX98_KNOWN_FEATURES") {
    return &FOR_EACH_CXX98_FEATURE(STRING_LIST_ELEMENT)[1];
  }
  if (prop == "CMAKE_CXX11_KNOWN_FEATURES") {
    return &FOR_EACH_CXX11_FEATURE(STRING_LIST_ELEMENT)[1];
  }
  if (prop == "CMAKE_CXX14_KNOWN_FEATURES") {
    return &FOR_EACH_CXX14_FEATURE(STRING_LIST_ELEMENT)[1];
  }

#undef STRING_LIST_ELEMENT
  return this->GlobalProperties.GetPropertyValue(prop);
}